

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 *puVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  char *local_10;
  
  puVar1 = *(undefined8 **)this;
  local_68 = *puVar1;
  uStack_60 = puVar1[1];
  local_40 = *(undefined8 *)(*(long *)(this + 8) + 0x150);
  local_48 = *(undefined8 *)(*(long *)(this + 8) + 0x158);
  local_78 = 1;
  local_70 = "\"";
  local_58 = 0x12;
  local_50 = "\" is resolved to \"";
  local_38 = 0x78;
  local_30 = 
  "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
  ;
  local_28 = *puVar1;
  uStack_20 = puVar1[1];
  local_18 = 0x25;
  local_10 = "\") to start from the outermost scope.";
  pieces._M_len =
       (size_type)
       "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
  ;
  pieces._M_array = (iterator)0x7;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_78,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}